

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_oFFs(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  png_int_32 local_3c;
  png_int_32 local_38;
  int unit_type;
  png_int_32 offset_y;
  png_int_32 offset_x;
  byte local_20;
  byte local_1f;
  byte local_1e;
  png_byte buf [9];
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  buf._1_4_ = length;
  unique0x1000020a = info_ptr;
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 4) == 0) {
      if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x100) == 0)) {
        if (length == 9) {
          png_crc_read(png_ptr,(png_bytep)((long)&offset_y + 3),9);
          iVar1 = png_crc_finish(png_ptr,0);
          if (iVar1 == 0) {
            if ((offset_y._3_1_ & 0x80) == 0) {
              local_38 = (uint)offset_y._3_1_ * 0x1000000 + (uint)(byte)offset_x * 0x10000 +
                         (uint)offset_x._1_1_ * 0x100 + (uint)offset_x._2_1_;
            }
            else {
              local_38 = -(((uint)offset_y._3_1_ * 0x1000000 + (uint)(byte)offset_x * 0x10000 +
                            (uint)offset_x._1_1_ * 0x100 + (uint)offset_x._2_1_ ^ 0xffffffff) + 1 &
                          0x7fffffff);
            }
            if ((offset_x._3_1_ & 0x80) == 0) {
              local_3c = (uint)offset_x._3_1_ * 0x1000000 + (uint)local_20 * 0x10000 +
                         (uint)local_1f * 0x100 + (uint)local_1e;
            }
            else {
              local_3c = -(((uint)offset_x._3_1_ * 0x1000000 + (uint)local_20 * 0x10000 +
                            (uint)local_1f * 0x100 + (uint)local_1e ^ 0xffffffff) + 1 & 0x7fffffff);
            }
            png_set_oFFs(png_ptr,stack0xffffffffffffffe8,local_38,local_3c,(uint)buf[0]);
          }
        }
        else {
          png_crc_finish(png_ptr,length);
          png_chunk_benign_error(png_ptr,"invalid");
        }
      }
      else {
        png_crc_finish(png_ptr,length);
        png_chunk_benign_error(png_ptr,"duplicate");
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"out of place");
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_oFFs(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[9];
   png_int_32 offset_x, offset_y;
   int unit_type;

   png_debug(1, "in png_handle_oFFs");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_oFFs) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (length != 9)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 9);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   offset_x = png_get_int_32(buf);
   offset_y = png_get_int_32(buf + 4);
   unit_type = buf[8];
   png_set_oFFs(png_ptr, info_ptr, offset_x, offset_y, unit_type);
}